

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testSendOnSocket(int count,short port)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  long ticks;
  int i;
  long start;
  SocketInitiator initiator;
  SocketAcceptor local_a88 [8];
  SocketAcceptor acceptor;
  ScreenLogFactory local_8e8 [8];
  ScreenLogFactory logFactory;
  undefined1 local_848 [8];
  SessionSettings settings;
  MemoryStoreFactory factory;
  TestApplication application;
  string local_798;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  allocator<char> local_721;
  string local_720;
  undefined1 local_700 [8];
  SessionID sessionID;
  NewOrderSingle message;
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_318;
  undefined1 local_2f8 [8];
  Symbol symbol;
  undefined1 local_290 [8];
  HandlInst handlInst;
  STRING local_228;
  undefined1 local_208 [8];
  ClOrdID clOrdID;
  stringstream local_198 [8];
  stringstream stream;
  ostream local_188 [378];
  ushort local_e;
  int local_c;
  short port_local;
  int count_local;
  
  local_e = port;
  local_c = count;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"[DEFAULT]");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SocketConnectHost=localhost");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SocketConnectPort=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SocketAcceptPort=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_e);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SocketReuseAddress=Y");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"StartTime=00:00:00");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"EndTime=00:00:00");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"UseDataDictionary=N");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"BeginString=FIX.4.2");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"PersistMessages=N");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"[SESSION]");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"ConnectionType=acceptor");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SenderCompID=SERVER");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"TargetCompID=CLIENT");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"[SESSION]");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"ConnectionType=initiator");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"SenderCompID=CLIENT");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"TargetCompID=SERVER");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"HeartBtInt=30");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,"ORDERID",
             (allocator<char> *)&handlInst.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::ClOrdID::ClOrdID((ClOrdID *)local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)&handlInst.super_CharField.super_FieldBase.m_metrics.field_0xf);
  symbol.super_StringField.super_FieldBase.m_metrics._15_1_ = 0x31;
  FIX::HandlInst::HandlInst
            ((HandlInst *)local_290,&symbol.super_StringField.super_FieldBase.m_metrics.field_0xf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"LNUX",
             (allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Symbol::Symbol((Symbol *)local_2f8,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator
            ((allocator<char> *)&side.super_CharField.super_FieldBase.m_metrics.field_0xf);
  FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum
                  ,"11");
  FIX::TransactTime::TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::OrdType::OrdType((OrdType *)&message.super_Message.field_0x150,"1");
  FIX42::NewOrderSingle::NewOrderSingle
            ((NewOrderSingle *)((long)&sessionID.m_frozenString.field_2 + 8),(ClOrdID *)local_208,
             (HandlInst *)local_290,(Symbol *)local_2f8,
             (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.m_checksum,
             (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum,
             (OrdType *)&message.super_Message.field_0x150);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"FIX.4.2",&local_721);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"CLIENT",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"SERVER",&local_771);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"",(allocator<char> *)&application.field_0xf);
  FIX::SessionID::SessionID((SessionID *)local_700,&local_720,&local_748,&local_770,&local_798);
  std::__cxx11::string::~string((string *)&local_798);
  std::allocator<char>::~allocator((allocator<char> *)&application.field_0xf);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  std::__cxx11::string::~string((string *)&local_720);
  std::allocator<char>::~allocator(&local_721);
  TestApplication::TestApplication((TestApplication *)&factory);
  FIX::MemoryStoreFactory::MemoryStoreFactory((MemoryStoreFactory *)&settings.m_resolveEnvVars);
  FIX::SessionSettings::SessionSettings((SessionSettings *)local_848,(istream *)local_198,false);
  FIX::ScreenLogFactory::ScreenLogFactory(local_8e8,(SessionSettings *)local_848);
  FIX::SocketAcceptor::SocketAcceptor
            (local_a88,(Application *)&factory,(MessageStoreFactory *)&settings.m_resolveEnvVars,
             (SessionSettings *)local_848);
  FIX::Acceptor::start();
  FIX::SocketInitiator::SocketInitiator
            ((SocketInitiator *)&start,(Application *)&factory,
             (MessageStoreFactory *)&settings.m_resolveEnvVars,(SessionSettings *)local_848);
  FIX::Initiator::start();
  FIX::process_sleep(1.0);
  lVar3 = GetTickCount();
  for (ticks._4_4_ = 0; ticks._4_4_ <= local_c; ticks._4_4_ = ticks._4_4_ + 1) {
    FIX::Session::sendToTarget
              ((Message *)(sessionID.m_frozenString.field_2._M_local_buf + 8),(SessionID *)local_700
              );
  }
  while (iVar1 = TestApplication::getCount((TestApplication *)&factory), iVar1 < local_c) {
    FIX::process_sleep(0.1);
  }
  lVar4 = GetTickCount();
  FIX::Initiator::stop(false);
  FIX::Acceptor::stop(SUB81(local_a88,0));
  FIX::SocketInitiator::~SocketInitiator((SocketInitiator *)&start);
  FIX::SocketAcceptor::~SocketAcceptor(local_a88);
  FIX::ScreenLogFactory::~ScreenLogFactory(local_8e8);
  FIX::SessionSettings::~SessionSettings((SessionSettings *)local_848);
  FIX::MemoryStoreFactory::~MemoryStoreFactory((MemoryStoreFactory *)&settings.m_resolveEnvVars);
  TestApplication::~TestApplication((TestApplication *)&factory);
  FIX::SessionID::~SessionID((SessionID *)local_700);
  FIX42::NewOrderSingle::~NewOrderSingle
            ((NewOrderSingle *)((long)&sessionID.m_frozenString.field_2 + 8));
  FIX::OrdType::~OrdType((OrdType *)&message.super_Message.field_0x150);
  FIX::TransactTime::~TransactTime
            ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics.m_checksum);
  FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics.
                            m_checksum);
  FIX::Symbol::~Symbol((Symbol *)local_2f8);
  FIX::HandlInst::~HandlInst((HandlInst *)local_290);
  FIX::ClOrdID::~ClOrdID((ClOrdID *)local_208);
  std::__cxx11::stringstream::~stringstream(local_198);
  return lVar4 - lVar3;
}

Assistant:

long testSendOnSocket( int count, short port )
{
  std::stringstream stream;
  stream
    << "[DEFAULT]" << std::endl
    << "SocketConnectHost=localhost" << std::endl
    << "SocketConnectPort=" << (unsigned short)port << std::endl
    << "SocketAcceptPort=" << (unsigned short)port << std::endl
    << "SocketReuseAddress=Y" << std::endl
    << "StartTime=00:00:00" << std::endl
    << "EndTime=00:00:00" << std::endl
    << "UseDataDictionary=N" << std::endl
    << "BeginString=FIX.4.2" << std::endl
    << "PersistMessages=N" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=acceptor" << std::endl
    << "SenderCompID=SERVER" << std::endl
    << "TargetCompID=CLIENT" << std::endl
    << "[SESSION]" << std::endl
    << "ConnectionType=initiator" << std::endl
    << "SenderCompID=CLIENT" << std::endl
    << "TargetCompID=SERVER" << std::endl
    << "HeartBtInt=30" << std::endl;

  FIX::ClOrdID clOrdID( "ORDERID" );
  FIX::HandlInst handlInst( '1' );
  FIX::Symbol symbol( "LNUX" );
  FIX::Side side( FIX::Side_BUY );
  FIX::TransactTime transactTime;
  FIX::OrdType ordType( FIX::OrdType_MARKET );
  FIX42::NewOrderSingle message( clOrdID, handlInst, symbol, side, transactTime, ordType );

  FIX::SessionID sessionID( "FIX.4.2", "CLIENT", "SERVER" );

  TestApplication application;
  FIX::MemoryStoreFactory factory;
  FIX::SessionSettings settings( stream );
  FIX::ScreenLogFactory logFactory( settings );

  FIX::SocketAcceptor acceptor( application, factory, settings );
  acceptor.start();

  FIX::SocketInitiator initiator( application, factory, settings );
  initiator.start();

  FIX::process_sleep( 1 );

  long start = GetTickCount();

  for ( int i = 0; i <= count; ++i )
    FIX::Session::sendToTarget( message, sessionID );

  while( application.getCount() < count )
    FIX::process_sleep( 0.1 );

  long ticks = GetTickCount() - start;

  initiator.stop();
  acceptor.stop();

  return ticks;
}